

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcEco.c
# Opt level: O2

Gia_Man_t * Bmc_EcoMiter(Gia_Man_t *pGold,Gia_Man_t *pOld,Vec_Int_t *vFans)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *p;
  size_t sVar6;
  char *__dest;
  Gia_Obj_t *pGVar7;
  Gia_Obj_t *pGVar8;
  Gia_Man_t *pGVar9;
  char *pcVar10;
  int iVar11;
  
  pGVar5 = Gia_ManPo(pOld,~pOld->nRegs + pOld->vCos->nSize);
  if (pGold->vCis->nSize == pOld->vCis->nSize) {
    if (pGold->vCos->nSize == pOld->vCos->nSize + -1) {
      pGVar5 = pGVar5 + -(ulong)((uint)*(undefined8 *)pGVar5 & 0x1fffffff);
      if (((int)(uint)*(undefined8 *)pGVar5 < 0) ||
         (((uint)*(undefined8 *)pGVar5 & 0x1fffffff) == 0x1fffffff)) {
        pcVar10 = "Gia_ObjIsAnd(pRoot)";
        uVar1 = 0x38;
      }
      else {
        p = Gia_ManStart(pGold->nObjs * 3);
        pcVar10 = pGold->pName;
        iVar11 = 0;
        if (pcVar10 == (char *)0x0) {
          __dest = (char *)0x0;
        }
        else {
          sVar6 = strlen(pcVar10);
          __dest = (char *)malloc(sVar6 + 1);
          strcpy(__dest,pcVar10);
        }
        p->pName = __dest;
        Gia_ManHashAlloc(p);
        pGold->pObjs->Value = 0;
        for (; iVar11 < pGold->vCis->nSize; iVar11 = iVar11 + 1) {
          pGVar7 = Gia_ManCi(pGold,iVar11);
          if (pGVar7 == (Gia_Obj_t *)0x0) break;
          uVar1 = Gia_ManAppendCi(p);
          pGVar7->Value = uVar1;
        }
        uVar1 = Gia_ManAppendCi(p);
        for (iVar11 = 0; iVar11 < pGold->nObjs; iVar11 = iVar11 + 1) {
          pGVar7 = Gia_ManObj(pGold,iVar11);
          if (pGVar7 == (Gia_Obj_t *)0x0) break;
          if ((~*(uint *)pGVar7 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar7) {
            iVar2 = Gia_ObjFanin0Copy(pGVar7);
            iVar3 = Gia_ObjFanin1Copy(pGVar7);
            uVar4 = Gia_ManHashAnd(p,iVar2,iVar3);
            pGVar7->Value = uVar4;
          }
        }
        for (iVar11 = 0; iVar11 < pGold->vCos->nSize; iVar11 = iVar11 + 1) {
          pGVar7 = Gia_ManCo(pGold,iVar11);
          if (pGVar7 == (Gia_Obj_t *)0x0) break;
          uVar4 = Gia_ObjFanin0Copy(pGVar7);
          pGVar7->Value = uVar4;
        }
        pOld->pObjs->Value = 0;
        for (iVar11 = 0; iVar11 < pOld->vCis->nSize; iVar11 = iVar11 + 1) {
          pGVar7 = Gia_ManCi(pOld,iVar11);
          if (pGVar7 == (Gia_Obj_t *)0x0) break;
          pGVar8 = Gia_ManCi(pGold,iVar11);
          pGVar7->Value = pGVar8->Value;
        }
        for (iVar11 = 0; iVar11 < pOld->nObjs; iVar11 = iVar11 + 1) {
          pGVar7 = Gia_ManObj(pOld,iVar11);
          if (pGVar7 == (Gia_Obj_t *)0x0) break;
          if ((~*(uint *)pGVar7 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar7) {
            uVar4 = uVar1;
            if (pGVar7 != pGVar5) {
              iVar2 = Gia_ObjFanin0Copy(pGVar7);
              iVar3 = Gia_ObjFanin1Copy(pGVar7);
              uVar4 = Gia_ManHashAnd(p,iVar2,iVar3);
            }
            pGVar7->Value = uVar4;
          }
        }
        for (iVar11 = 0; iVar11 < pOld->vCos->nSize; iVar11 = iVar11 + 1) {
          pGVar7 = Gia_ManCo(pOld,iVar11);
          if (pGVar7 == (Gia_Obj_t *)0x0) break;
          uVar4 = Gia_ObjFanin0Copy(pGVar7);
          pGVar7->Value = uVar4;
        }
        for (iVar11 = 0; iVar11 < pGold->vCos->nSize; iVar11 = iVar11 + 1) {
          pGVar7 = Gia_ManCo(pGold,iVar11);
          if (pGVar7 == (Gia_Obj_t *)0x0) break;
          uVar4 = pGVar7->Value;
          pGVar7 = Gia_ManCo(pOld,iVar11);
          iVar2 = Gia_ManHashXor(p,uVar4,pGVar7->Value);
          Gia_ManAppendCo(p,iVar2);
        }
        for (iVar11 = 0; iVar11 < pOld->nObjs; iVar11 = iVar11 + 1) {
          pGVar7 = Gia_ManObj(pOld,iVar11);
          if (pGVar7 == (Gia_Obj_t *)0x0) break;
          if ((~*(uint *)pGVar7 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar7) {
            if (pGVar7 == pGVar5) {
              uVar4 = Abc_LitNot(uVar1);
            }
            else {
              iVar2 = Gia_ObjFanin0Copy(pGVar7);
              iVar3 = Gia_ObjFanin1Copy(pGVar7);
              uVar4 = Gia_ManHashAnd(p,iVar2,iVar3);
            }
            pGVar7->Value = uVar4;
          }
        }
        for (iVar11 = 0; iVar11 < pOld->vCos->nSize; iVar11 = iVar11 + 1) {
          pGVar5 = Gia_ManCo(pOld,iVar11);
          if (pGVar5 == (Gia_Obj_t *)0x0) break;
          uVar1 = Gia_ObjFanin0Copy(pGVar5);
          pGVar5->Value = uVar1;
        }
        iVar11 = 0;
        for (iVar2 = 0; iVar2 < pGold->vCos->nSize; iVar2 = iVar2 + 1) {
          pGVar5 = Gia_ManCo(pGold,iVar2);
          if (pGVar5 == (Gia_Obj_t *)0x0) break;
          uVar1 = pGVar5->Value;
          pGVar5 = Gia_ManCo(pOld,iVar2);
          iVar3 = Gia_ManHashXor(p,uVar1,pGVar5->Value);
          iVar11 = Gia_ManHashOr(p,iVar11,iVar3);
        }
        Gia_ManAppendCo(p,iVar11);
        for (iVar11 = 0; iVar11 < vFans->nSize; iVar11 = iVar11 + 1) {
          iVar2 = Vec_IntEntry(vFans,iVar11);
          pGVar5 = Gia_ManObj(pOld,iVar2);
          if (pGVar5 == (Gia_Obj_t *)0x0) break;
          Gia_ManAppendCo(p,pGVar5->Value);
        }
        pGVar9 = Gia_ManCleanup(p);
        Gia_ManStop(p);
        if (pGVar9->vCis->nSize - pGVar9->nRegs == pGold->vCis->nSize + 1) {
          if (pGVar9->vCos->nSize - pGVar9->nRegs == pGold->vCos->nSize + vFans->nSize + 1) {
            return pGVar9;
          }
          pcVar10 = "Gia_ManPoNum(pNew) == Gia_ManCoNum(pGold) + 1 + Vec_IntSize(vFans)";
          uVar1 = 0x66;
        }
        else {
          pcVar10 = "Gia_ManPiNum(pNew) == Gia_ManCiNum(pGold) + 1";
          uVar1 = 0x65;
        }
      }
    }
    else {
      pcVar10 = "Gia_ManCoNum(pGold) == Gia_ManCoNum(pOld) - 1";
      uVar1 = 0x37;
    }
  }
  else {
    pcVar10 = "Gia_ManCiNum(pGold) == Gia_ManCiNum(pOld)";
    uVar1 = 0x36;
  }
  __assert_fail(pcVar10,
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                ,uVar1,"Gia_Man_t *Bmc_EcoMiter(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Computes miter for ECO with given root node and fanins.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Gia_Man_t * Bmc_EcoMiter( Gia_Man_t * pGold, Gia_Man_t * pOld, Vec_Int_t * vFans )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pRoot = Gia_ObjFanin0( Gia_ManPo(pOld, Gia_ManPoNum(pOld)-1) ); // fanin of the last PO
    Gia_Obj_t * pObj;
    int i, NewPi, Miter;
    assert( Gia_ManCiNum(pGold) == Gia_ManCiNum(pOld) );
    assert( Gia_ManCoNum(pGold) == Gia_ManCoNum(pOld) - 1 );
    assert( Gia_ObjIsAnd(pRoot) );
    // create the miter
    pNew = Gia_ManStart( 3 * Gia_ManObjNum(pGold) );
    pNew->pName = Abc_UtilStrsav( pGold->pName );
    Gia_ManHashAlloc( pNew );
    // copy gold
    Gia_ManConst0(pGold)->Value = 0;
    Gia_ManForEachCi( pGold, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    NewPi = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( pGold, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( pGold, pObj, i )
        pObj->Value = Gia_ObjFanin0Copy( pObj );
    // create onset
    Gia_ManConst0(pOld)->Value = 0;
    Gia_ManForEachCi( pOld, pObj, i )
        pObj->Value = Gia_ManCi(pGold, i)->Value;
    Gia_ManForEachAnd( pOld, pObj, i )
        if ( pObj == pRoot )
            pObj->Value = NewPi;
        else
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( pOld, pObj, i )
        pObj->Value = Gia_ObjFanin0Copy( pObj );
    Gia_ManForEachCo( pGold, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ManHashXor(pNew, pObj->Value, Gia_ManCo(pOld, i)->Value) );
    // create offset
    Gia_ManForEachAnd( pOld, pObj, i )
        if ( pObj == pRoot )
            pObj->Value = Abc_LitNot(NewPi);
        else
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( pOld, pObj, i )
        pObj->Value = Gia_ObjFanin0Copy( pObj );
    Miter = 0;
    Gia_ManForEachCo( pGold, pObj, i )
        Miter = Gia_ManHashOr( pNew, Miter, Gia_ManHashXor(pNew, pObj->Value, Gia_ManCo(pOld, i)->Value) );
    Gia_ManAppendCo( pNew, Miter );
    // add outputs for the nodes
    Gia_ManForEachObjVec( vFans, pOld, pObj, i )
        Gia_ManAppendCo( pNew, pObj->Value );
    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    assert( Gia_ManPiNum(pNew) == Gia_ManCiNum(pGold) + 1 );
    assert( Gia_ManPoNum(pNew) == Gia_ManCoNum(pGold) + 1 + Vec_IntSize(vFans) );
    return pNew;
}